

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Capabilities __thiscall
QICOPlugin::capabilities(QICOPlugin *this,QIODevice *device,QByteArray *format)

{
  bool bVar1;
  char cVar2;
  QFlagsStorage<QImageIOPlugin::Capability> QVar3;
  QFlagsStorage<QImageIOPlugin::Capability> QVar4;
  long in_FS_OFFSET;
  char *local_30;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = "ico";
  bVar1 = operator==(format,&local_28);
  if (bVar1) {
    QVar3.i = 3;
  }
  else {
    local_30 = "cur";
    bVar1 = operator==(format,&local_30);
    QVar3.i = 3;
    if ((!bVar1) && (QVar3.i = 0, (format->d).size == 0)) {
      cVar2 = QIODevice::isOpen();
      if (cVar2 != '\0') {
        cVar2 = QIODevice::isReadable();
        QVar4.i = 0;
        if (cVar2 != '\0') {
          bVar1 = QtIcoHandler::canRead(device);
          QVar4.i = (Int)bVar1;
        }
        cVar2 = QIODevice::isWritable();
        QVar3.i = QVar4.i + 2;
        if (cVar2 == '\0') {
          QVar3.i = QVar4.i;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QFlagsStorageHelper<QImageIOPlugin::Capability,_4>)
           (QFlagsStorageHelper<QImageIOPlugin::Capability,_4>)QVar3.i;
  }
  __stack_chk_fail();
}

Assistant:

QImageIOPlugin::Capabilities QICOPlugin::capabilities(QIODevice *device, const QByteArray &format) const
{
    if (format == "ico" || format == "cur")
        return Capabilities(CanRead | CanWrite);
    if (!format.isEmpty())
        return { };
    if (!device->isOpen())
        return { };

    Capabilities cap;
    if (device->isReadable() && QtIcoHandler::canRead(device))
        cap |= CanRead;
    if (device->isWritable())
        cap |= CanWrite;
    return cap;
}